

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall
wabt::TypeChecker::OnBlock(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Type *pTVar1;
  Result RVar2;
  Type *pTVar3;
  LabelType local_2c;
  unsigned_long local_28;
  
  RVar2 = PopAndCheckSignature(this,param_types,"block");
  local_2c = Block;
  local_28 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
  std::vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>>::
  emplace_back<wabt::LabelType&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,unsigned_long>
            ((vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>> *)
             &this->label_stack_,&local_2c,param_types,result_types,&local_28);
  pTVar1 = (param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar3 = (param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
    PushType(this,*pTVar3);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnBlock(const TypeVector& param_types,
                            const TypeVector& result_types) {
  Result result = PopAndCheckSignature(param_types, "block");
  PushLabel(LabelType::Block, param_types, result_types);
  PushTypes(param_types);
  return result;
}